

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::Transformations::Transformations(Transformations *this,Transformations *param_2)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  undefined8 *size;
  ulong local_b0;
  
  *in_RDI = *in_RSI;
  size = in_RDI + 1;
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  pvVar2 = alignedMalloc((size_t)size,(size_t)in_RDI);
  size[3] = pvVar2;
  for (local_b0 = 0; local_b0 < (ulong)size[1]; local_b0 = local_b0 + 1) {
    puVar4 = (undefined8 *)(size[3] + local_b0 * 0x40);
    puVar3 = (undefined8 *)(in_RSI[4] + local_b0 * 0x40);
    uVar1 = puVar3[1];
    *puVar4 = *puVar3;
    puVar4[1] = uVar1;
    uVar1 = puVar3[3];
    puVar4[2] = puVar3[2];
    puVar4[3] = uVar1;
    uVar1 = puVar3[5];
    puVar4[4] = puVar3[4];
    puVar4[5] = uVar1;
    uVar1 = puVar3[7];
    puVar4[6] = puVar3[6];
    puVar4[7] = uVar1;
  }
  *(byte *)(in_RDI + 5) = *(byte *)(in_RSI + 5) & 1;
  return;
}

Assistant:

__forceinline Transformations() {}